

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathNodeSetGrow(xmlNodeSetPtr cur)

{
  int iVar1;
  xmlNodePtr *ppxVar2;
  int newSize;
  xmlNodePtr *temp;
  xmlNodeSetPtr cur_local;
  
  iVar1 = xmlGrowCapacity(cur->nodeMax,8,10,10000000);
  if (iVar1 < 0) {
    cur_local._4_4_ = -1;
  }
  else {
    ppxVar2 = (xmlNodePtr *)(*xmlRealloc)(cur->nodeTab,(long)iVar1 << 3);
    if (ppxVar2 == (xmlNodePtr *)0x0) {
      cur_local._4_4_ = -1;
    }
    else {
      cur->nodeMax = iVar1;
      cur->nodeTab = ppxVar2;
      cur_local._4_4_ = 0;
    }
  }
  return cur_local._4_4_;
}

Assistant:

static int
xmlXPathNodeSetGrow(xmlNodeSetPtr cur) {
    xmlNodePtr *temp;
    int newSize;

    newSize = xmlGrowCapacity(cur->nodeMax, sizeof(temp[0]),
                              XML_NODESET_DEFAULT, XPATH_MAX_NODESET_LENGTH);
    if (newSize < 0)
        return(-1);
    temp = xmlRealloc(cur->nodeTab, newSize * sizeof(temp[0]));
    if (temp == NULL)
        return(-1);
    cur->nodeMax = newSize;
    cur->nodeTab = temp;

    return(0);
}